

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O0

ByteStream * __thiscall QPdf::ByteStream::operator<<(ByteStream *this,QPointF *p)

{
  long lVar1;
  QPointF *in_RSI;
  ByteStream *in_RDI;
  long in_FS_OFFSET;
  char buf [256];
  ByteStream *this_00;
  QIODevice *buf_00;
  char *val;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  val = &DAT_aaaaaaaaaaaaaaaa;
  buf_00 = (QIODevice *)&DAT_aaaaaaaaaaaaaaaa;
  QPointF::x(in_RSI);
  this_00 = (ByteStream *)&stack0xfffffffffffffef8;
  qt_real_to_string((qreal)val,(char *)buf_00);
  operator<<(this_00,(char *)in_RDI);
  QPointF::y(in_RSI);
  qt_real_to_string((qreal)val,(char *)buf_00);
  operator<<(this_00,(char *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ByteStream &ByteStream::operator <<(const QPointF &p) {
        char buf[256];
        qt_real_to_string(p.x(), buf);
        *this << buf;
        qt_real_to_string(p.y(), buf);
        *this << buf;
        return *this;
    }